

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mongoose.c
# Opt level: O0

char * parse_http_headers(char *s,char *end,int len,http_message *req)

{
  int iVar1;
  mg_str *v_00;
  mg_str *v_01;
  char *s_00;
  size_t sVar2;
  bool bVar3;
  mg_str *v;
  mg_str *k;
  int i;
  http_message *req_local;
  int len_local;
  char *end_local;
  char *s_local;
  
  k._4_4_ = 0;
  end_local = s;
  while( true ) {
    if (0x26 < k._4_4_) {
      return end_local;
    }
    v_00 = req->header_names + k._4_4_;
    v_01 = req->header_values + k._4_4_;
    s_00 = mg_skip(end_local,end,": ",v_00);
    end_local = mg_skip(s_00,end,"\r\n",v_01);
    while( true ) {
      bVar3 = false;
      if (v_01->len != 0) {
        bVar3 = v_01->p[v_01->len - 1] == ' ';
      }
      if (!bVar3) break;
      v_01->len = v_01->len - 1;
    }
    if ((v_00->len == 0) || (v_01->len == 0)) break;
    iVar1 = mg_ncasecmp(v_00->p,"Content-Length",0xe);
    if (iVar1 == 0) {
      sVar2 = strtoll(v_01->p,(char **)0x0,10);
      (req->body).len = sVar2;
      (req->message).len = (long)len + (req->body).len;
    }
    k._4_4_ = k._4_4_ + 1;
  }
  v_01->p = (char *)0x0;
  v_00->p = (char *)0x0;
  v_01->len = 0;
  v_00->len = 0;
  return end_local;
}

Assistant:

static const char *parse_http_headers(const char *s, const char *end, int len,
                                      struct http_message *req) {
    int i;
    for (i = 0; i < (int) ARRAY_SIZE(req->header_names) - 1; i++) {
        struct mg_str *k = &req->header_names[i], *v = &req->header_values[i];

        s = mg_skip(s, end, ": ", k);
        s = mg_skip(s, end, "\r\n", v);

        while (v->len > 0 && v->p[v->len - 1] == ' ') {
            v->len--; /* Trim trailing spaces in header value */
        }

        if (k->len == 0 || v->len == 0) {
            k->p = v->p = NULL;
            k->len = v->len = 0;
            break;
        }

        if (!mg_ncasecmp(k->p, "Content-Length", 14)) {
            req->body.len = to64(v->p);
            req->message.len = len + req->body.len;
        }
    }

    return s;
}